

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::String::caselessFind(String *this,char *b,int pos)

{
  size_t sVar1;
  int local_44;
  undefined1 local_38 [8];
  tagbstring t;
  int pos_local;
  char *b_local;
  String *this_local;
  
  if (b == (char *)0x0) {
    this_local._4_4_ = -1;
  }
  else if ((uint)(this->super_tagbstring).slen < (uint)pos) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = pos;
    if (*b != '\0') {
      if (pos == (this->super_tagbstring).slen) {
        this_local._4_4_ = -1;
      }
      else {
        t._0_8_ = b;
        t.data._4_4_ = pos;
        if (b == (char *)0x0) {
          local_44 = 0;
        }
        else {
          sVar1 = strlen(b);
          local_44 = (int)sVar1;
        }
        local_38._4_4_ = local_44;
        local_38._0_4_ = -1;
        this_local._4_4_ = binstrcaseless(&this->super_tagbstring,t.data._4_4_,(bstring)local_38);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int String::caselessFind(const char * b, int pos) const
    {
        struct tagbstring t;

        if (NULL == b) return BSTR_ERR;

        if ((unsigned int) pos > (unsigned int) slen)    return BSTR_ERR;
        if ('\0' == b[0])            return pos;
        if (pos == slen)            return BSTR_ERR;

        btfromcstr(t, b);
        return binstrcaseless((bstring) this, pos, (bstring) &t);
    }